

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

void duckdb::QuantileListOperation<short,true>::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<short,duckdb::QuantileStandardType>>
               (QuantileState<short,_duckdb::QuantileStandardType> *state,list_entry_t *target,
               AggregateFinalizeData *finalize_data)

{
  bool bVar1;
  short sVar2;
  QuantileValue *q_00;
  reference puVar3;
  size_type sVar4;
  undefined8 *in_RDX;
  idx_t *in_RSI;
  vector<short,_std::allocator<short>_> *in_RDI;
  Interpolator<true> interp;
  value_type *quantile;
  unsigned_long *q;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_long,_true> *__range3;
  idx_t lower;
  list_entry_t *entry;
  short *v_t;
  short *rdata;
  idx_t ridx;
  Vector *result;
  QuantileBindData *bind_data;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  Vector *in_stack_ffffffffffffff40;
  vector<short,_std::allocator<short>_> *in_stack_ffffffffffffff50;
  Interpolator<true> *this;
  undefined8 local_98;
  AggregateFinalizeData *in_stack_ffffffffffffff80;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_60;
  vector<unsigned_long,_true> *local_58;
  undefined8 local_50;
  idx_t *local_48;
  short *local_40;
  short *local_38;
  QuantileValue *local_30;
  Vector *local_28;
  QuantileBindData *local_20;
  undefined8 *local_18;
  idx_t *local_10;
  vector<short,_std::allocator<short>_> *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = ::std::vector<short,_std::allocator<short>_>::empty(in_stack_ffffffffffffff50);
  if (bVar1) {
    AggregateFinalizeData::ReturnNull(in_stack_ffffffffffffff80);
  }
  else {
    optional_ptr<duckdb::FunctionData,_true>::operator->
              ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffff40);
    local_20 = FunctionData::Cast<duckdb::QuantileBindData>
                         ((FunctionData *)in_stack_ffffffffffffff40);
    local_28 = ListVector::GetEntry((Vector *)0x1d4c2e5);
    q_00 = (QuantileValue *)
           ListVector::GetListSize
                     ((Vector *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    this = (Interpolator<true> *)*local_18;
    local_30 = q_00;
    ::std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>::size
              (&(local_20->quantiles).
                super_vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>);
    ListVector::Reserve(in_stack_ffffffffffffff40,
                        CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    local_38 = FlatVector::GetData<short>((Vector *)0x1d4c352);
    local_40 = ::std::vector<short,_std::allocator<short>_>::data
                         ((vector<short,_std::allocator<short>_> *)0x1d4c367);
    local_48 = local_10;
    *local_10 = (idx_t)local_30;
    local_50 = 0;
    local_58 = &local_20->order;
    local_60._M_current =
         (unsigned_long *)
         ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_ffffffffffffff40,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
      if (!bVar1) break;
      puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_60);
      in_stack_ffffffffffffff40 =
           (Vector *)
           vector<duckdb::QuantileValue,_true>::operator[]
                     ((vector<duckdb::QuantileValue,_true> *)in_stack_ffffffffffffff40,
                      CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
      ::std::vector<short,_std::allocator<short>_>::size(local_8);
      Interpolator<true>::Interpolator
                (this,q_00,(idx_t)in_stack_ffffffffffffff40,(bool)in_stack_ffffffffffffff3f);
      sVar2 = Interpolator<true>::Operation<short,short,duckdb::QuantileDirect<short>>
                        (this,(short *)q_00,in_stack_ffffffffffffff40,
                         (QuantileDirect<short> *)
                         CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
      local_38[(long)(&(local_30->val).type_.id_ + *puVar3)] = sVar2;
      local_50 = local_98;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_60);
    }
    sVar4 = ::std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>::size
                      (&(local_20->quantiles).
                        super_vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>)
    ;
    local_48[1] = sVar4;
    ListVector::SetListSize
              (in_stack_ffffffffffffff40,
               CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  }
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v.data();
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<DISCRETE> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			rdata[ridx + q] = interp.template Operation<typename STATE::InputType, CHILD_TYPE>(v_t, result);
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}